

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O2

void __thiscall GslSpan_RbeginRend_Test::TestBody(GslSpan_RbeginRend_Test *this)

{
  bool bVar1;
  reference ptVar2;
  reference lhs;
  pointer *__ptr;
  char *pcVar3;
  iterator __end1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_13;
  reverse_iterator beyond;
  reverse_iterator it;
  Message local_78;
  reverse_iterator first;
  AssertHelper local_60;
  span<int,__1L> s;
  int a [4];
  
  s.storage_.data_ = a;
  a._0_8_ = &DAT_200000001;
  a[2] = 3;
  a[3] = 4;
  s.storage_.super_extent_type<_1L>.size_ = 4;
  pstore::gsl::span<int,_-1L>::rbegin((span<int,__1L> *)&it.current);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&first.current,&it.current);
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)&beyond,"it","first",
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&it.current,
             (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
              *)&first.current);
  if ((char)beyond.current.span_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (beyond.current.index_ == 0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)beyond.current.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x438,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&beyond.current.index_);
  ptVar2 = std::
           reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
           ::operator*(&it);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>((internal *)&beyond,"*it","4",ptVar2,(int *)&gtest_ar_2);
  if ((char)beyond.current.span_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (beyond.current.index_ == 0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)beyond.current.index_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x439,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    if ((long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&beyond.current.index_);
  pstore::gsl::span<int,_-1L>::rend((span<int,__1L> *)&beyond);
  testing::internal::
  CmpHelperNE<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)&gtest_ar_2,"it","beyond",&it,&beyond);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x43c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  __end1.span_ = (span<int,__1L> *)std::operator-(&beyond,&first);
  gtest_ar_13.success_ = true;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"beyond - first","4",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x43e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  __end1.span_ = (span<int,__1L> *)std::operator-(&first,&first);
  gtest_ar_13.success_ = false;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"first - first","0",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x43f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  __end1.span_ = (span<int,__1L> *)std::operator-(&beyond,&beyond);
  gtest_ar_13.success_ = false;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"beyond - beyond","0",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x440,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator--(&it.current);
  __end1.span_ = (span<int,__1L> *)
                 std::operator-((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                                 *)&it.current,&first);
  gtest_ar_13.success_ = true;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"it - first","1",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x443,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  ptVar2 = std::
           reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
           ::operator*(&it);
  __end1.span_ = (span<int,__1L> *)CONCAT44(__end1.span_._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_2,"*it","3",ptVar2,(int *)&__end1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x444,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  ptVar2 = std::
           reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
           ::operator*(&it);
  *ptVar2 = 0x16;
  ptVar2 = std::
           reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
           ::operator*(&it);
  __end1.span_ = (span<int,__1L> *)CONCAT44(__end1.span_._4_4_,0x16);
  testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_2,"*it","22",ptVar2,(int *)&__end1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x446,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  __end1.span_ = (span<int,__1L> *)std::operator-(&beyond,&it);
  gtest_ar_13.success_ = true;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"beyond - it","3",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x447,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  it.current.span_ = first.current.span_;
  it.current.index_ = first.current.index_;
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)&gtest_ar_2,"it","first",&it,&first);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x44a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  while( true ) {
    pstore::gsl::span<int,_-1L>::rend((span<int,__1L> *)&gtest_ar_2);
    bVar1 = std::operator!=((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                             *)&it.current,
                            (reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                             *)&gtest_ar_2);
    if (!bVar1) break;
    ptVar2 = std::
             reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>_>
             ::operator*((reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,__1L>,_false>_>
                          *)&it.current);
    *ptVar2 = 5;
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator--(&it.current)
    ;
  }
  testing::internal::
  CmpHelperEQ<std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>,std::reverse_iterator<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>>
            ((internal *)&gtest_ar_2,"it","beyond",&it,&beyond);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x450,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  __end1.span_ = (span<int,__1L> *)std::operator-(&it,&beyond);
  gtest_ar_13.success_ = false;
  gtest_ar_13._1_3_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_2,"it - beyond","0",(long *)&__end1,(int *)&gtest_ar_13);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&__end1);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      pcVar3 = *(char **)gtest_ar_2.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x451,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13,(Message *)&__end1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
    if (__end1.span_ != (span<int,__1L> *)0x0) {
      (**(code **)(((__end1.span_)->storage_).super_extent_type<_1L>.size_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  pstore::gsl::span<int,_-1L>::begin((span<int,__1L> *)&gtest_ar_2);
  pstore::gsl::span<int,_-1L>::end((span<int,__1L> *)&__end1);
  while (((span<int,__1L> *)CONCAT44(gtest_ar_2._4_4_,gtest_ar_2._0_4_) != __end1.span_ ||
         (gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )__end1.index_))) {
    lhs = pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator*
                    ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)&gtest_ar_2);
    local_78.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar_13,"n","5",lhs,(int *)&local_78);
    if (gtest_ar_13.success_ == false) {
      testing::Message::Message(&local_78);
      pcVar3 = anon_var_dwarf_73ef0 + 0x50;
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_13.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar3 = *(char **)gtest_ar_13.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
                 ,0x454,pcVar3);
      testing::internal::AssertHelper::operator=(&local_60,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if ((long *)CONCAT44(local_78.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_78.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_78.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_13.message_);
    pstore::gsl::details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::operator++
              ((span_iterator<pstore::gsl::span<int,__1L>,_false> *)&gtest_ar_2);
  }
  return;
}

Assistant:

TEST (GslSpan, RbeginRend) {
    {
        int a[] = {1, 2, 3, 4};
        span<int> s = make_span (a);

        auto it = s.rbegin ();
        auto first = it;
        EXPECT_EQ (it, first);
        EXPECT_EQ (*it, 4);

        auto beyond = s.rend ();
        EXPECT_NE (it, beyond);

        EXPECT_EQ (beyond - first, 4);
        EXPECT_EQ (first - first, 0);
        EXPECT_EQ (beyond - beyond, 0);

        ++it;
        EXPECT_EQ (it - first, 1);
        EXPECT_EQ (*it, 3);
        *it = 22;
        EXPECT_EQ (*it, 22);
        EXPECT_EQ (beyond - it, 3);

        it = first;
        EXPECT_EQ (it, first);
        while (it != s.rend ()) {
            *it = 5;
            ++it;
        }

        EXPECT_EQ (it, beyond);
        EXPECT_EQ (it - beyond, 0);

        for (auto & n : s) {
            EXPECT_EQ (n, 5);
        }
    }
}